

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Compress c;
  cmCPackLog *pcVar3;
  pointer pbVar4;
  long *plVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  string *psVar9;
  size_t sVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  ostringstream cmCPackLog_msg_1;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  long *local_508;
  long local_500;
  long local_4f8 [2];
  undefined1 local_4e8 [16];
  _func_int *local_4d8 [12];
  ios_base local_478 [264];
  undefined1 local_370 [64];
  _Alloc_hider local_330;
  size_type local_328;
  undefined1 local_290 [112];
  ios_base local_220 [504];
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->super_cmCPackGenerator).packageFileNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &(this->super_cmCPackGenerator).toplevel);
  std::__cxx11::string::append
            ((char *)(this->super_cmCPackGenerator).packageFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  pcVar2 = local_290 + 0x10;
  local_290._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"CPACK_ARCHIVE_FILE_NAME","");
  bVar7 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_290);
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if (bVar7) {
    local_290._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_290,"CPACK_ARCHIVE_FILE_NAME","");
    psVar9 = (string *)
             cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_290);
    if (psVar9 == (string *)0x0) {
      psVar9 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::_M_append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,(ulong)(psVar9->_M_dataplus)._M_p)
    ;
  }
  else {
    local_290._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_290,"CPACK_PACKAGE_FILE_NAME","");
    psVar9 = (string *)
             cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_290);
    if (psVar9 == (string *)0x0) {
      psVar9 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::_M_append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,(ulong)(psVar9->_M_dataplus)._M_p)
    ;
  }
  if ((pointer)local_290._0_8_ != pcVar2) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::__cxx11::string::append
            ((char *)(this->super_cmCPackGenerator).packageFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_290,
             "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
             ,0x59);
  std::ios::widen((char)(ostringstream *)local_290 + (char)*(undefined8 *)(local_290._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_290);
  std::ostream::flush();
  pcVar3 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar6 = local_4e8._0_8_;
  sVar10 = strlen((char *)local_4e8._0_8_);
  cmCPackLog::Log(pcVar3,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x11a,(char *)uVar6,sVar10);
  if ((_func_int **)local_4e8._0_8_ != local_4d8) {
    operator_delete((void *)local_4e8._0_8_,(ulong)(local_4d8[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
  std::ios_base::~ios_base(local_220);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_290,None);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)local_290,
             (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,false,true);
  iVar8 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])(this,local_290);
  if (iVar8 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e8,"Problem to generate Header for archive <",0x28);
    pbVar4 = (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4e8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,">.",2);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar6 = local_370._0_8_;
    sVar10 = strlen((char *)local_370._0_8_);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x11b,(char *)uVar6,sVar10);
    if ((ostream *)local_370._0_8_ != (ostream *)(local_370 + 0x10)) {
      operator_delete((void *)local_370._0_8_,(ulong)((long)(uint *)local_370._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
    std::ios_base::~ios_base(local_478);
    iVar8 = 0;
    goto LAB_0019bfab;
  }
  c = this->Compress;
  iVar8 = GetThreadCount(this);
  cmArchiveWrite::cmArchiveWrite
            ((cmArchiveWrite *)local_370,(ostream *)local_290,c,&this->ArchiveFormat,0,iVar8);
  bVar7 = cmArchiveWrite::Open((cmArchiveWrite *)local_370);
  if (bVar7) {
    if (local_328 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4e8,"Problem to create archive <",0x1b);
      pbVar4 = (this_00->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4e8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,">, ERROR = ",0xb);
      local_508 = local_4f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_508,local_330._M_p,local_330._M_p + local_328);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(char *)local_508,local_500);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if (local_508 != local_4f8) {
        operator_delete(local_508,local_4f8[0] + 1);
      }
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar5 = local_508;
      sVar10 = strlen((char *)local_508);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x11b,(char *)plVar5,sVar10);
      goto LAB_0019bf68;
    }
    p_Var12 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
    iVar8 = 1;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      do {
        addOneComponentToArchive(this,(cmArchiveWrite *)local_370,(cmCPackComponent *)(p_Var12 + 2))
        ;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4e8,"Problem to open archive <",0x19);
    pbVar4 = (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4e8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,">, ERROR = ",0xb);
    local_508 = local_4f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_508,local_330._M_p,local_330._M_p + local_328);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_508,local_500);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if (local_508 != local_4f8) {
      operator_delete(local_508,local_4f8[0] + 1);
    }
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    plVar5 = local_508;
    sVar10 = strlen((char *)local_508);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x11b,(char *)plVar5,sVar10);
LAB_0019bf68:
    if (local_508 != local_4f8) {
      operator_delete(local_508,local_4f8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
    std::ios_base::~ios_base(local_478);
    iVar8 = 0;
  }
  cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_370);
LAB_0019bfab:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  return iVar8;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  this->packageFileNames.clear();
  this->packageFileNames.emplace_back(this->toplevel);
  this->packageFileNames[0] += "/";

  if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    this->packageFileNames[0] += *this->GetOption("CPACK_ARCHIVE_FILE_NAME");
  } else {
    this->packageFileNames[0] += *this->GetOption("CPACK_PACKAGE_FILE_NAME");
  }

  this->packageFileNames[0] += this->GetOutputExtension();

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                  << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);

  // The ALL COMPONENTS in ONE package case
  for (auto& comp : this->Components) {
    // Add the files of this component to the archive
    this->addOneComponentToArchive(archive, &(comp.second));
  }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}